

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Clear_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Clear_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  AssertHelper *this_00;
  char *in_RDI;
  AssertionResult gtest_ar;
  int i;
  int in_stack_ffffffffffffff6c;
  HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffff70;
  uint *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffff90;
  Type in_stack_ffffffffffffff9c;
  AssertHelper *in_stack_ffffffffffffffa0;
  AssertionResult local_48 [3];
  Message *in_stack_ffffffffffffffe8;
  value_type in_stack_fffffffffffffff0;
  int iVar2;
  
  for (iVar2 = 1; iVar2 < 200; iVar2 = iVar2 + 1) {
    in_stack_ffffffffffffff78 = (uint *)(in_RDI + 0x10);
    in_stack_fffffffffffffff0 =
         HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)CONCAT44(iVar2,in_stack_fffffffffffffff0),(value_type *)in_stack_ffffffffffffffe8);
  }
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::clear((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *)0xb8d340);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::size((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)0xb8d356);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),in_RDI,
             in_stack_ffffffffffffff78,(unsigned_long *)in_stack_ffffffffffffff70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_48);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffa0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xb8d3a8)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff8c,in_RDI);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar2,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0xb8d3f6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb8d446);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Clear) {
  for (int i = 1; i < 200; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  this->ht_.clear();
  EXPECT_EQ(0u, this->ht_.size());
  // TODO(csilvers): do we want to enforce that the hashtable has or
  // has not shrunk?  It does for dense_* but not sparse_*.
}